

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<float,__1,__1,_0,_4,_4> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,4,4>>::
_set_noalias<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,4,4>> *this,
          DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *other)

{
  Matrix<float,__1,__1,_0,_4,_4> *pMVar1;
  Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *other_00;
  DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *other_local;
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *this_local;
  
  pMVar1 = EigenBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::derived
                     ((EigenBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *)this);
  other_00 = EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::derived
                       ((EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>
                         *)other);
  pMVar1 = internal::
           assign_selector<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_false,_false>
           ::run(pMVar1,other_00);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      return internal::assign_selector<Derived,OtherDerived,false>::run(this->derived(), other.derived());
    }